

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.hpp
# Opt level: O1

Pixel<unsigned_char,_4> * __thiscall
eos::core::Image<eos::core::Pixel<unsigned_char,_4>_>::operator()
          (Image<eos::core::Pixel<unsigned_char,_4>_> *this,int y,int x)

{
  Pixel<unsigned_char,_4> *pPVar1;
  
  if ((this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      (this->data_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __assert_fail("data_.size() > 0",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                  ,0x47,
                  "PixelType &eos::core::Image<eos::core::Pixel<unsigned char, 4>>::operator()(int, int) [PixelType = eos::core::Pixel<unsigned char, 4>]"
                 );
  }
  if ((-1 < y) && (y < this->height_)) {
    if ((-1 < x) && (x < this->width_)) {
      pPVar1 = (Pixel<unsigned_char,_4> *)byte_ptr(this,y,x);
      return pPVar1;
    }
    __assert_fail("x >= 0 && x < width_",
                  "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                  ,0x4a,
                  "PixelType &eos::core::Image<eos::core::Pixel<unsigned char, 4>>::operator()(int, int) [PixelType = eos::core::Pixel<unsigned char, 4>]"
                 );
  }
  __assert_fail("y >= 0 && y < height_",
                "/workspace/llm4binary/github/license_c_cmakelists/patrikhuber[P]eos/include/eos/core/Image.hpp"
                ,0x49,
                "PixelType &eos::core::Image<eos::core::Pixel<unsigned char, 4>>::operator()(int, int) [PixelType = eos::core::Pixel<unsigned char, 4>]"
               );
}

Assistant:

PixelType& operator()(int y, int x) noexcept
    {
        assert(data_.size() > 0); // byte_ptr() checks this but let's put the assert here too, because this
                                  // function is public-facing.
        assert(y >= 0 && y < height_);
        assert(x >= 0 && x < width_);
        return *data(y, x);
    }